

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ihevc_dpb_mgr.c
# Opt level: O3

void ihevc_dpb_mgr_del_ref(dpb_mgr_t *ps_dpb_mgr,buf_mgr_t *ps_buf_mgr,WORD32 i4_abs_poc)

{
  byte bVar1;
  dpb_info_t *pdVar2;
  dpb_info_t *pdVar3;
  uint uVar4;
  dpb_info_t *pdVar5;
  bool bVar6;
  
  pdVar2 = ps_dpb_mgr->ps_dpb_head;
  bVar1 = ps_dpb_mgr->u1_num_ref_bufs;
  if (pdVar2->ps_pic_buf->i4_abs_poc != i4_abs_poc) {
    uVar4 = 1;
    pdVar5 = pdVar2;
    if (1 < bVar1) {
      while (pdVar5->ps_prev_dpb->ps_pic_buf->i4_abs_poc != i4_abs_poc) {
        uVar4 = uVar4 + 1;
        pdVar5 = pdVar5->ps_prev_dpb;
        if (bVar1 == uVar4) {
          return;
        }
      }
    }
    if (uVar4 == bVar1) {
      return;
    }
    pdVar3 = pdVar5->ps_prev_dpb;
    bVar6 = pdVar3 != pdVar2;
    pdVar2 = pdVar3;
    if (bVar6) {
      pdVar5->ps_prev_dpb = pdVar3->ps_prev_dpb;
      pdVar3->ps_prev_dpb = (dpb_info_t *)0x0;
      goto LAB_0016d16f;
    }
  }
  ps_dpb_mgr->ps_dpb_head = pdVar2->ps_prev_dpb;
  pdVar3 = pdVar2;
LAB_0016d16f:
  ps_dpb_mgr->u1_num_ref_bufs = bVar1 - 1;
  ihevc_buf_mgr_release(ps_buf_mgr,(uint)pdVar3->ps_pic_buf->u1_buf_id,2);
  pdVar3->ps_pic_buf = (pic_buf_t *)0x0;
  pdVar3->ps_prev_dpb = (dpb_info_t *)0x0;
  return;
}

Assistant:

void ihevc_dpb_mgr_del_ref(dpb_mgr_t *ps_dpb_mgr,
                           buf_mgr_t *ps_buf_mgr,
                           WORD32 i4_abs_poc)
{
    int i;
    dpb_info_t *ps_next_dpb;

    dpb_info_t *ps_unmark_node;
    UWORD8 u1_del_node;
    UNUSED(u1_del_node);
    u1_del_node = 0;

    /* Find the node with matching absolute POC */
    ps_next_dpb = ps_dpb_mgr->ps_dpb_head;
    if(ps_next_dpb->ps_pic_buf->i4_abs_poc == i4_abs_poc)
    {
        ps_unmark_node = ps_next_dpb;
    }
    else
    {
        for(i = 1; i < ps_dpb_mgr->u1_num_ref_bufs; i++)
        {
            if(ps_next_dpb->ps_prev_dpb->ps_pic_buf->i4_abs_poc == i4_abs_poc)
                break;
            ps_next_dpb = ps_next_dpb->ps_prev_dpb;
        }

        if(i == ps_dpb_mgr->u1_num_ref_bufs)
        {
            return;
        }
        else
            ps_unmark_node = ps_next_dpb->ps_prev_dpb;
    }

    if(ps_unmark_node == ps_dpb_mgr->ps_dpb_head)
    {
        ps_dpb_mgr->ps_dpb_head = ps_unmark_node->ps_prev_dpb;
    }
    else
    {
        ps_next_dpb->ps_prev_dpb = ps_unmark_node->ps_prev_dpb; //update link
        ps_unmark_node->ps_prev_dpb = NULL;
    }
    ps_dpb_mgr->u1_num_ref_bufs--; //decrement buffer count

    /* Release the physical buffer */
    ihevc_buf_mgr_release((buf_mgr_t *)ps_buf_mgr, ps_unmark_node->ps_pic_buf->u1_buf_id,
                          BUF_MGR_REF);
    ps_unmark_node->ps_prev_dpb = NULL;
    ps_unmark_node->ps_pic_buf = NULL;
}